

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui-ext.cpp
# Opt level: O3

ImVec2_Simple
igCalcTextSize_nonUDT2(char *text,char *text_end,bool hide_text_after_double_hash,float wrap_width)

{
  ImVec2_Simple IVar1;
  ImVec2 IVar2;
  
  IVar2 = ImGui::CalcTextSize(text,text_end,hide_text_after_double_hash,wrap_width);
  IVar1.x = IVar2.x;
  IVar1.y = IVar2.y;
  return IVar1;
}

Assistant:

CIMGUI_API ImVec2_Simple *_igCalcTextSize_nonUDT2 (char *larg1, char *larg2, int larg3, float larg4) {
  ImVec2_Simple * lresult = (ImVec2_Simple *)0 ;
  char *arg1 = (char *) 0 ;
  char *arg2 = (char *) 0 ;
  bool arg3 ;
  float arg4 ;
  ImVec2_Simple result;
  
  arg1 = larg1;
  arg2 = larg2;
  arg3 = (bool)larg3;
  arg4 = larg4;
  try {
    result = igCalcTextSize_nonUDT2((char const *)arg1,(char const *)arg2,arg3,arg4);
    lresult = new ImVec2_Simple(result);
    return lresult;
  } catch (...) {
    return (ImVec2_Simple *)0;
  }
}